

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_manager.hpp
# Opt level: O2

void __thiscall
ylt::metric::dynamic_metric_manager<test_id_t<31UL>_>::clean_label_expired
          (dynamic_metric_manager<test_id_t<31UL>_> *this)

{
  shared_ptr<coro_io::io_context_pool> *this_00;
  LazyBase<void,_true> in_stack_ffffffffffffffa0;
  undefined1 local_58 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  shared_ptr<coro_io::io_context_pool> sp;
  __weak_ptr<coro_io::period_timer,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  coro_io::create_io_context_pool<coro_io::io_context_pool>
            (in_stack_ffffffffffffffa0._coro.__handle_._4_4_);
  this_00 = &this->executor_;
  std::__shared_ptr<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&this_00->super___shared_ptr<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2>,
             &sp.super___shared_ptr<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sp.super___shared_ptr<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_ptr<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&sp.super___shared_ptr<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2>,
             &this_00->super___shared_ptr<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2>);
  coro_io::io_context_pool::get_executor
            ((this->executor_).
             super___shared_ptr<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::
  make_shared<coro_io::period_timer,coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,0ul>>*>
            ((ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_> **)
             (local_58 + 8));
  std::__shared_ptr<coro_io::period_timer,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->timer_).super___shared_ptr<coro_io::period_timer,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<coro_io::period_timer,_(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  std::__weak_ptr<coro_io::period_timer,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<coro_io::period_timer,void>
            (local_30,&(this->timer_).
                       super___shared_ptr<coro_io::period_timer,_(__gnu_cxx::_Lock_policy)2>);
  check_label_expired((dynamic_metric_manager<test_id_t<31UL>_> *)local_58,
                      (weak_ptr<coro_io::period_timer> *)this);
  coro_io::io_context_pool::get_executor
            ((this_00->super___shared_ptr<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr);
  async_simple::coro::Lazy<void>::via((Lazy<void> *)&stack0xffffffffffffffa0,(Executor *)local_58);
  std::__shared_ptr<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8),
             &sp.super___shared_ptr<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2>);
  async_simple::coro::detail::LazyBase<void,_true>::
  start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_include_cinatra_ylt_metric_metric_manager_hpp:467:16)>
            ((LazyBase<void,_true> *)&stack0xffffffffffffffa0,(type *)(local_58 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  async_simple::coro::detail::LazyBase<void,_true>::~LazyBase
            ((LazyBase<void,_true> *)&stack0xffffffffffffffa0);
  async_simple::coro::detail::LazyBase<void,_false>::~LazyBase((LazyBase<void,_false> *)local_58);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sp.super___shared_ptr<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void clean_label_expired() {
    executor_ = coro_io::create_io_context_pool(1);
    auto sp = executor_;
    timer_ = std::make_shared<coro_io::period_timer>(executor_->get_executor());
    check_label_expired(timer_)
        .via(executor_->get_executor())
        .start([sp](auto&&) {
        });
  }